

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

CURLcode Curl_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  size_t sVar1;
  bool bVar2;
  uchar *local_60;
  uchar *newstr;
  size_t rawlen;
  ulong uStack_48;
  uchar lastQuantum [3];
  size_t numQuantums;
  size_t i;
  size_t equalsTerm;
  size_t length;
  size_t *outlen_local;
  uchar **outptr_local;
  char *src_local;
  
  equalsTerm = 0;
  i = 0;
  *outptr = (uchar *)0x0;
  *outlen = 0;
  while( true ) {
    bVar2 = false;
    if (src[equalsTerm] != '=') {
      bVar2 = src[equalsTerm] != '\0';
    }
    if (!bVar2) break;
    equalsTerm = equalsTerm + 1;
  }
  if ((src[equalsTerm] == '=') && (i = 1, src[equalsTerm + 1] == '=')) {
    i = 2;
  }
  uStack_48 = equalsTerm + i >> 2;
  if (uStack_48 == 0) {
    src_local._4_4_ = CURLE_OK;
  }
  else {
    sVar1 = uStack_48 * 3 - i;
    local_60 = (uchar *)(*Curl_cmalloc)(sVar1 + 4);
    if (local_60 == (uchar *)0x0) {
      src_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      *outptr = local_60;
      outptr_local = (uchar **)src;
      for (numQuantums = 0; numQuantums < uStack_48 - 1; numQuantums = numQuantums + 1) {
        decodeQuantum(local_60,(char *)outptr_local);
        local_60 = local_60 + 3;
        outptr_local = (uchar **)((long)outptr_local + 4);
      }
      decodeQuantum((uchar *)((long)&rawlen + 5),(char *)outptr_local);
      for (numQuantums = 0; numQuantums < 3 - i; numQuantums = numQuantums + 1) {
        local_60[numQuantums] = *(uchar *)((long)&rawlen + numQuantums + 5);
      }
      local_60[numQuantums] = '\0';
      *outlen = sVar1;
      src_local._4_4_ = CURLE_OK;
    }
  }
  return src_local._4_4_;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t length = 0;
  size_t equalsTerm = 0;
  size_t i;
  size_t numQuantums;
  unsigned char lastQuantum[3];
  size_t rawlen = 0;
  unsigned char *newstr;

  *outptr = NULL;
  *outlen = 0;

  while((src[length] != '=') && src[length])
    length++;
  /* A maximum of two = padding characters is allowed */
  if(src[length] == '=') {
    equalsTerm++;
    if(src[length+equalsTerm] == '=')
      equalsTerm++;
  }
  numQuantums = (length + equalsTerm) / 4;

  /* Don't allocate a buffer if the decoded length is 0 */
  if(numQuantums == 0)
    return CURLE_OK;

  rawlen = (numQuantums * 3) - equalsTerm;

  /* The buffer must be large enough to make room for the last quantum
  (which may be partially thrown out) and the zero terminator. */
  newstr = malloc(rawlen+4);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  *outptr = newstr;

  /* Decode all but the last quantum (which may not decode to a
  multiple of 3 bytes) */
  for(i = 0; i < numQuantums - 1; i++) {
    decodeQuantum(newstr, src);
    newstr += 3; src += 4;
  }

  /* This final decode may actually read slightly past the end of the buffer
  if the input string is missing pad bytes.  This will almost always be
  harmless. */
  decodeQuantum(lastQuantum, src);
  for(i = 0; i < 3 - equalsTerm; i++)
    newstr[i] = lastQuantum[i];

  newstr[i] = '\0'; /* zero terminate */

  *outlen = rawlen; /* return size of decoded data */

  return CURLE_OK;
}